

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

bool Dijkstra(DAG *_Dag)

{
  bool bVar1;
  pointer pDVar2;
  const_reference __x;
  byte *pbVar3;
  difference_type dVar4;
  iterator iter;
  uint32_t nextW;
  uint32_t curW;
  int j;
  iterator next;
  iterator loc;
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  _minHeap;
  list<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  value_type *in_stack_ffffffffffffff48;
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  *this;
  _Self local_80;
  _List_node_base *local_78;
  DAG_node *local_70;
  DAG_node *local_68;
  _List_iterator<unsigned_char> local_50;
  uint32_t local_44;
  uint32_t local_40;
  uint local_3c;
  __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_> local_38;
  __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_> local_30;
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  local_28;
  
  this = &local_28;
  std::
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node*,std::vector<DAG_node,std::allocator<DAG_node>>>,std::vector<__gnu_cxx::__normal_iterator<DAG_node*,std::vector<DAG_node,std::allocator<DAG_node>>>,std::allocator<__gnu_cxx::__normal_iterator<DAG_node*,std::vector<DAG_node,std::allocator<DAG_node>>>>>,std::less<__gnu_cxx::__normal_iterator<DAG_node*,std::vector<DAG_node,std::allocator<DAG_node>>>>>
  ::
  priority_queue<std::vector<__gnu_cxx::__normal_iterator<DAG_node*,std::vector<DAG_node,std::allocator<DAG_node>>>,std::allocator<__gnu_cxx::__normal_iterator<DAG_node*,std::vector<DAG_node,std::allocator<DAG_node>>>>>,void>
            ((priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_38._M_current =
       (DAG_node *)
       std::vector<DAG_node,_std::allocator<DAG_node>_>::begin
                 ((vector<DAG_node,_std::allocator<DAG_node>_> *)in_stack_ffffffffffffff28);
  local_30._M_current = local_38._M_current;
  std::_List_iterator<unsigned_char>::_List_iterator(&local_50);
  std::
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ::push(this,in_stack_ffffffffffffff48);
  pDVar2 = __gnu_cxx::
           __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>::
           operator->(&local_30);
  pDVar2->visited = true;
  do {
    __x = std::
          priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
          ::top((priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
                 *)0x1154e5);
    local_30._M_current = __x->_M_current;
    std::
    priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
    ::pop((priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_68 = (DAG_node *)
               std::vector<DAG_node,_std::allocator<DAG_node>_>::end
                         ((vector<DAG_node,_std::allocator<DAG_node>_> *)in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator>=
                      ((__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>::
               operator->(&local_30);
      bVar1 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (&pDVar2->nextPos);
      if (bVar1) {
        local_70 = (DAG_node *)
                   __gnu_cxx::
                   __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                   ::operator+((__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                                *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        local_38 = (__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                   )local_70;
        pDVar2 = __gnu_cxx::
                 __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>::
                 operator->(&local_38);
        if ((pDVar2->visited & 1U) == 0) {
          std::
          priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
          ::push(this,__x);
          pDVar2 = __gnu_cxx::
                   __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                   ::operator->(&local_38);
          pDVar2->visited = true;
        }
      }
      else {
        pDVar2 = __gnu_cxx::
                 __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>::
                 operator->(&local_30);
        local_40 = pDVar2->Weight;
        __gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
        ::operator->(&local_30);
        local_78 = (_List_node_base *)
                   std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::begin
                             (in_stack_ffffffffffffff28);
        local_50._M_node = local_78;
        while( true ) {
          __gnu_cxx::
          __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>::
          operator->(&local_30);
          local_80._M_node =
               (_List_node_base *)
               std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::end
                         (in_stack_ffffffffffffff28);
          bVar1 = std::operator!=(&local_50,&local_80);
          if (!bVar1) break;
          pbVar3 = std::_List_iterator<unsigned_char>::operator*
                             ((_List_iterator<unsigned_char> *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          local_3c = (uint)*pbVar3;
          in_stack_ffffffffffffff40 = local_40;
          std::vector<DAG_node,_std::allocator<DAG_node>_>::begin
                    ((vector<DAG_node,_std::allocator<DAG_node>_> *)in_stack_ffffffffffffff28);
          __gnu_cxx::operator-
                    ((__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                      *)in_stack_ffffffffffffff28);
          in_stack_ffffffffffffff44 =
               getPathWeight((int *)__x,
                             (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          local_44 = in_stack_ffffffffffffff40 + in_stack_ffffffffffffff44;
          local_38 = __gnu_cxx::
                     __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                     ::operator+((__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          in_stack_ffffffffffffff3c = local_44;
          pDVar2 = __gnu_cxx::
                   __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                   ::operator->(&local_38);
          if (in_stack_ffffffffffffff3c < pDVar2->Weight) {
            in_stack_ffffffffffffff34 = local_44;
            pDVar2 = __gnu_cxx::
                     __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                     ::operator->(&local_38);
            pDVar2->Weight = in_stack_ffffffffffffff34;
            std::vector<DAG_node,_std::allocator<DAG_node>_>::begin
                      ((vector<DAG_node,_std::allocator<DAG_node>_> *)in_stack_ffffffffffffff28);
            dVar4 = __gnu_cxx::operator-
                              ((__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                                *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                                *)in_stack_ffffffffffffff28);
            in_stack_ffffffffffffff38 = (int)dVar4;
            pDVar2 = __gnu_cxx::
                     __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                     ::operator->(&local_38);
            pDVar2->prev = in_stack_ffffffffffffff38;
          }
          pDVar2 = __gnu_cxx::
                   __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                   ::operator->(&local_38);
          if ((pDVar2->visited & 1U) == 0) {
            std::
            priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
            ::push(this,__x);
            pDVar2 = __gnu_cxx::
                     __normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>
                     ::operator->(&local_38);
            pDVar2->visited = true;
          }
          std::_List_iterator<unsigned_char>::operator++(&local_50,0);
        }
      }
    }
    bVar1 = std::
            priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
            ::empty((priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
                     *)0x1157d8);
    in_stack_ffffffffffffff30 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  std::
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ::~priority_queue((priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
                     *)0x1157f9);
  return true;
}

Assistant:

bool Dijkstra(DAG &_Dag)
{
    priority_queue<vector<DAG_node>::iterator> _minHeap;
    auto loc = _Dag.begin();
    auto next = loc;
    int j;
    uint32_t curW, nextW;
    list<uint8_t>::iterator iter;
    _minHeap.push(loc);
    loc->visited = true;
    do {
        loc = _minHeap.top();
        _minHeap.pop();
        if (loc >= _Dag.end()) continue;
        if (loc->nextPos.empty()) {
           next = loc + 1;
           if (! next->visited) {
             _minHeap.push(next);
             next->visited = true;
           }
           continue;
        }
        curW = loc->Weight;
        for (iter = loc->nextPos.begin(); iter != loc->nextPos.end(); iter++) {
             j = *iter;
             nextW = curW + getPathWeight(int(loc-_Dag.begin()), j);
             next = loc + j;
             if (nextW < next->Weight) {
                 next->Weight = nextW;
                 next->prev = int(loc - _Dag.begin());
             }
             if ( ! next->visited ) {
                _minHeap.push(next);
                next->visited = true;
             }
        }

    } while ( ! _minHeap.empty() );
    return true;
}